

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2051f::QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test::TestBody
          (QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test *this)

{
  qsbr_epoch qVar1;
  char *pcVar2;
  qsbr_per_thread *pqVar3;
  _Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  _Var4;
  _Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false> _Var5;
  qsbr *this_00;
  long **__stat_loc;
  undefined1 auVar6 [16];
  long *local_48;
  __uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> local_40;
  long local_38;
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> local_30;
  long local_28;
  qsbr_thread second_thread;
  
  pcVar2 = (char *)unodb::test::QSBRTestBase::allocate();
  pqVar3 = (qsbr_per_thread *)operator_new(0x98);
  _Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl =
       (_Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>)operator_new(0x20);
  *(undefined8 *)
   _Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 8) = 0;
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 0x18) = 0;
  (pqVar3->previous_interval_orphan_list_node)._M_t.
  super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false> =
       _Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl;
  _Var5._M_head_impl = (dealloc_vector_list_node *)operator_new(0x20);
  *(undefined8 *)&(_Var5._M_head_impl)->requests = 0;
  *(pointer *)((long)&(_Var5._M_head_impl)->requests + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var5._M_head_impl)->requests + 0x10) = (pointer)0x0;
  (_Var5._M_head_impl)->next = (dealloc_vector_list_node *)0x0;
  (pqVar3->current_interval_orphan_list_node)._M_t.
  super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl =
       _Var5._M_head_impl;
  pqVar3->quiescent_states_since_epoch_change = 0;
  this_00 = unodb::qsbr::instance();
  qVar1 = unodb::qsbr::register_thread(this_00);
  (pqVar3->last_seen_quiescent_state_epoch).epoch_val = qVar1.epoch_val;
  (pqVar3->last_seen_epoch).epoch_val = qVar1.epoch_val;
  pqVar3->current_interval_total_dealloc_size = 0;
  (pqVar3->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pqVar3->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pqVar3->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pqVar3->current_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pqVar3->previous_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar3->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar3->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar3->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pqVar3->active_ptrs)._M_h._M_buckets = &(pqVar3->active_ptrs)._M_h._M_single_bucket;
  (pqVar3->active_ptrs)._M_h._M_bucket_count = 1;
  auVar6 = ZEXT416(0) << 0x40;
  (pqVar3->active_ptrs)._M_h._M_before_begin = (__node_base)auVar6._0_8_;
  (pqVar3->active_ptrs)._M_h._M_element_count = auVar6._8_8_;
  (pqVar3->active_ptrs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pqVar3->active_ptrs)._M_h._M_rehash_policy._M_next_resize = auVar6;
  local_40._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (tuple<unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)
       (_Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)0x0
  ;
  local_38 = 0;
  local_30._M_head_impl = pqVar3;
  local_48 = (long *)operator_new(0x18);
  *local_48 = (long)&PTR___State_impl_00177638;
  local_48[1] = (long)pcVar2;
  local_48[2] = (long)pqVar3;
  local_30._M_head_impl = (qsbr_per_thread *)0x0;
  __stat_loc = &local_48;
  std::thread::_M_start_thread(&local_38,__stat_loc,0);
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_30);
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_40);
  local_28 = local_38;
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  std::thread::join();
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  *pcVar2 = unodb::test::QSBRTestBase::touch_memory(char*,char)::value;
  unodb::test::QSBRTestBase::touch_memory(char*,char)::value =
       unodb::test::QSBRTestBase::touch_memory(char*,char)::value + '\x01';
  unodb::test::QSBRTestBase::quiescent();
  if (local_28 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

UNODB_TEST_F(QSBR, TwoThreadsDeallocateBeforeQuittingPointerStaysLive) {
  auto *ptr = static_cast<char *>(allocate());

  unodb::qsbr_thread second_thread{[ptr] {
    qsbr_deallocate(ptr);
    thread_syncs[0].notify();  // 1 ->
  }};

  thread_syncs[0].wait();  // 1 <-
  join(second_thread);

  touch_memory(ptr);

  quiescent();
}